

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool wildcardMatch(const_iterator str_first,const_iterator str_last,const_iterator p_first,
                  const_iterator p_last)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pcVar4;
  const_iterator in_RCX;
  const_iterator in_RDX;
  const_iterator in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  const_iterator in_stack_ffffffffffffffd0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  bool local_1;
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff38._M_current);
  if ((bVar1) &&
     (bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff38._M_current), bVar1)) {
    local_1 = true;
  }
  else {
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff38._M_current);
    if ((bVar1) &&
       (pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&stack0xffffffffffffffe0), *pcVar4 == '*')) {
      std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (in_stack_ffffffffffffff38,0x13d13c);
      local_1 = __gnu_cxx::operator==
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffff38._M_current);
    }
    else {
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff38._M_current);
      if (bVar1) {
        local_1 = false;
      }
      else {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&stack0xffffffffffffffe0);
        if (*pcVar4 != '?') {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&stack0xffffffffffffffe0);
          iVar2 = tolower((int)*pcVar4);
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_10);
          iVar3 = tolower((int)*pcVar4);
          if (iVar2 != iVar3) {
            pcVar4 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&stack0xffffffffffffffe0);
            if (*pcVar4 != '*') {
              return false;
            }
            std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (in_stack_ffffffffffffff38,0x13d2a6);
            bVar1 = wildcardMatch(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd0);
            if (bVar1) {
              return true;
            }
            std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (in_stack_ffffffffffffff38,0x13d32e);
            bVar1 = wildcardMatch(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd0);
            return bVar1;
          }
        }
        std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (in_stack_ffffffffffffff38,0x13d204);
        std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (in_stack_ffffffffffffff38,0x13d235);
        local_1 = wildcardMatch(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd0);
      }
    }
  }
  return local_1;
}

Assistant:

inline bool wildcardMatch(std::string::const_iterator str_first,
                          std::string::const_iterator str_last,
                          std::string::const_iterator p_first,
                          std::string::const_iterator p_last)
{
  if (str_first == str_last && p_first == p_last)
  { return true; }

  if (str_first == str_last)
  {
    if (*p_first == '*')
    {
      // if there is no more character after * => match
      return std::next(p_first) == p_last;
    }
  }

  if (p_first == p_last)
  {
    return false;
  }

  if (*p_first == '?' || std::tolower(*p_first) == std::tolower(*str_first))
  {
    return wildcardMatch(std::next(str_first), str_last,
                         std::next(p_first), p_last);
  }

  if (*p_first == '*')
  {
    return wildcardMatch(std::next(str_first), str_last, p_first, p_last) ||
           wildcardMatch(str_first, str_last, std::next(p_first), p_last);
  }

  return false;
}